

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O2

void * __thiscall
ft::deque<int,_ft::allocator<int>_>::realloc
          (deque<int,_ft::allocator<int>_> *this,void *__ptr,size_t __size)

{
  map_pointer ppiVar1;
  pointer piVar2;
  map_pointer ppiVar3;
  ulong uVar4;
  dequeIterator<int,_64UL> *pdVar5;
  map_pointer ppvVar6;
  long lVar7;
  long lVar8;
  size_type sVar9;
  pointer pvVar10;
  size_type sVar11;
  dequeIterator<int,_64UL> local_50;
  
  sVar11 = this->m_map_size + 4;
  ppiVar3 = (map_pointer)operator_new(this->m_map_size * 8 + 0x20);
  uVar4 = sVar11 - this->m_chunks >> 1;
  ppiVar1 = ppiVar3 + uVar4;
  ppvVar6 = (this->m_start).m_node;
  lVar7 = (long)(this->m_finish).m_node - (long)ppvVar6;
  lVar8 = 0;
  for (sVar9 = 0; sVar11 != sVar9; sVar9 = sVar9 + 1) {
    if (((long)sVar9 < (long)uVar4) ||
       ((ulong)(lVar7 + (long)ppiVar1) < (ulong)((long)ppiVar3 + lVar8))) {
      pvVar10 = (pointer)0x0;
    }
    else {
      pvVar10 = *ppvVar6;
      ppvVar6 = ppvVar6 + 1;
    }
    ppiVar3[sVar9] = pvVar10;
    lVar8 = lVar8 + 8;
  }
  operator_delete(this->m_map);
  this->m_map = ppiVar3;
  this->m_map_size = sVar11;
  (this->m_start).m_node = ppiVar1;
  piVar2 = *ppiVar1;
  pvVar10 = (this->m_start).m_first;
  (this->m_start).m_first = piVar2;
  (this->m_start).m_last = piVar2 + 0x40;
  (this->m_start).m_cur = (pointer)(((long)(this->m_start).m_cur - (long)pvVar10) + (long)piVar2);
  dequeIterator<int,_64UL>::operator+(&local_50,&this->m_start,this->m_size);
  pdVar5 = dequeIterator<int,_64UL>::operator=(&this->m_finish,&local_50);
  return pdVar5;
}

Assistant:

void	realloc() {
		chunk_allocator	chunk_alloc;

		size_type	newMapSize = this->m_map_size + 4;
		map_pointer	newMap = chunk_alloc.allocate(newMapSize);

		map_pointer	tmp_start = newMap + ((newMapSize - this->m_chunks) / 2);

		map_pointer	old_start = this->m_start.m_node;
		map_pointer	old_finish = this->m_finish.m_node;

		size_type	offset = old_finish - old_start;

		map_pointer	tmp = old_start;
		for (size_type i = 0; i < newMapSize; ++i) {
			pointer p = NULL;
			if (newMap + i >= tmp_start && newMap + i <= tmp_start + offset) {
				p = *tmp;
				++tmp;
			}
			chunk_alloc.construct(newMap + i, p);
		}

		for (size_type i = 0; i < this->m_map_size; ++i)
			chunk_alloc.destroy(this->m_map + i);
		chunk_alloc.deallocate(this->m_map, this->m_map_size);

		this->m_map = newMap;
		this->m_map_size = newMapSize;

		offset = this->m_start.m_cur - this->m_start.m_first;

		this->m_start.setNode(tmp_start);
		this->m_start.m_cur = this->m_start.m_first + offset;

		this->m_finish = this->m_start + this->size();
	}